

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataColors
          (MeshGeometry *this,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors_out,Scope *source,
          string *MappingInformationType,string *ReferenceInformationType)

{
  size_type vertex_count;
  string *ReferenceInformationType_local;
  string *MappingInformationType_local;
  Scope *source_local;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors_out_local;
  MeshGeometry *this_local;
  
  vertex_count = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           (&this->m_vertices);
  ResolveVertexDataArray<aiColor4t<float>>
            (colors_out,source,MappingInformationType,ReferenceInformationType,"Colors","ColorIndex"
             ,vertex_count,&this->m_mapping_counts,&this->m_mapping_offsets,&this->m_mappings);
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataColors(std::vector<aiColor4D>& colors_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    ResolveVertexDataArray(colors_out,source,MappingInformationType,ReferenceInformationType,
        "Colors",
        "ColorIndex",
        m_vertices.size(),
        m_mapping_counts,
        m_mapping_offsets,
        m_mappings);
}